

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5Bm25Function(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                     sqlite3_value **apVal)

{
  u64 n;
  double dVar1;
  bool bVar2;
  double dVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  void *__s;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  int nInst;
  sqlite3_int64 nRow;
  sqlite3_int64 nToken;
  int io;
  int local_6c;
  sqlite3_int64 local_68;
  uint *local_60;
  sqlite3_int64 local_58;
  long local_50;
  int local_44;
  sqlite3_context *local_40;
  sqlite3_value **local_38;
  
  local_6c = 0;
  iVar6 = 0;
  local_44 = nVal;
  local_40 = pCtx;
  local_38 = apVal;
  puVar7 = (uint *)(*pApi->xGetAuxdata)(pFts,0);
  if (puVar7 == (uint *)0x0) {
    puVar7 = (uint *)0x0;
    local_68 = 0;
    local_58 = 0;
    uVar5 = (*pApi->xPhraseCount)(pFts);
    n = (long)(int)(uVar5 * 2) * 8 + 0x20;
    iVar6 = sqlite3_initialize();
    if (iVar6 == 0) {
      puVar7 = (uint *)sqlite3Malloc(n);
    }
    if (puVar7 == (uint *)0x0) {
      iVar6 = 7;
    }
    else {
      memset(puVar7,0,n);
      *puVar7 = uVar5;
      *(uint **)(puVar7 + 4) = puVar7 + 8;
      *(uint **)(puVar7 + 6) = puVar7 + (long)(int)uVar5 * 2 + 8;
      iVar6 = (*pApi->xRowCount)(pFts,&local_68);
    }
    if (iVar6 == 0) {
      iVar6 = (*pApi->xColumnTotalSize)(pFts,-1,&local_58);
    }
    bVar11 = iVar6 == 0;
    if (bVar11) {
      *(double *)(puVar7 + 2) = (double)local_58 / (double)local_68;
    }
    local_60 = puVar7;
    if (0 < (int)uVar5 && iVar6 == 0) {
      uVar10 = 0;
      do {
        local_50 = 0;
        iVar6 = (*pApi->xQueryPhrase)(pFts,(int)uVar10,&local_50,fts5CountCb);
        bVar11 = iVar6 == 0;
        if (!bVar11) break;
        dVar14 = log(((double)(local_68 - local_50) + 0.5) / ((double)local_50 + 0.5));
        *(ulong *)(*(long *)(local_60 + 4) + uVar10 * 8) =
             ~-(ulong)(0.0 < dVar14) & 0x3eb0c6f7a0b5ed8d | (ulong)dVar14 & -(ulong)(0.0 < dVar14);
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar5);
    }
    puVar4 = local_60;
    if (bVar11) {
      iVar6 = (*pApi->xSetAuxdata)(pFts,local_60,sqlite3_free);
    }
    else {
      sqlite3_free(local_60);
    }
    puVar7 = (uint *)0x0;
    if (iVar6 == 0) {
      puVar7 = puVar4;
    }
  }
  if (iVar6 == 0) {
    __s = *(void **)(puVar7 + 6);
    memset(__s,0,(long)(int)*puVar7 << 3);
    iVar6 = (*pApi->xInstCount)(pFts,&local_6c);
  }
  else {
    __s = (void *)0x0;
  }
  bVar11 = iVar6 == 0;
  local_60 = puVar7;
  if ((bVar11) && (0 < local_6c)) {
    iVar9 = 1;
    do {
      iVar6 = (*pApi->xInst)(pFts,iVar9 + -1,(int *)&local_68,(int *)&local_58,(int *)&local_50);
      if (iVar6 == 0) {
        uVar12 = 0;
        uVar13 = 0x3ff00000;
        if ((int)local_58 < local_44) {
          dVar14 = sqlite3VdbeRealValue(local_38[(int)local_58]);
          uVar12 = SUB84(dVar14,0);
          uVar13 = (undefined4)((ulong)dVar14 >> 0x20);
        }
        *(double *)((long)__s + (long)(int)local_68 * 8) =
             (double)CONCAT44(uVar13,uVar12) + *(double *)((long)__s + (long)(int)local_68 * 8);
      }
      bVar11 = iVar6 == 0;
    } while ((bVar11) && (bVar2 = iVar9 < local_6c, iVar9 = iVar9 + 1, bVar2));
  }
  dVar14 = 0.0;
  if (bVar11) {
    iVar6 = (*pApi->xColumnSize)(pFts,-1,(int *)&local_68);
    dVar14 = (double)(int)local_68 * 0.75;
  }
  if (iVar6 == 0) {
    uVar8 = 0;
    uVar10 = (ulong)*local_60;
    if ((int)*local_60 < 1) {
      uVar10 = uVar8;
    }
    dVar3 = 0.0;
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      dVar1 = *(double *)((long)__s + uVar8 * 8);
      dVar3 = dVar3 + ((dVar1 * 2.2) / ((dVar14 / *(double *)(local_60 + 2) + 0.25) * 1.2 + dVar1))
                      * *(double *)(*(long *)(local_60 + 4) + uVar8 * 8);
    }
    sqlite3VdbeMemSetDouble(local_40->pOut,-dVar3);
  }
  else {
    sqlite3_result_error_code(local_40,iVar6);
  }
  return;
}

Assistant:

static void fts5Bm25Function(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  const double k1 = 1.2;          /* Constant "k1" from BM25 formula */
  const double b = 0.75;          /* Constant "b" from BM25 formula */
  int rc = SQLITE_OK;             /* Error code */
  double score = 0.0;             /* SQL function return value */
  Fts5Bm25Data *pData;            /* Values allocated/calculated once only */
  int i;                          /* Iterator variable */
  int nInst = 0;                  /* Value returned by xInstCount() */
  double D = 0.0;                 /* Total number of tokens in row */
  double *aFreq = 0;              /* Array of phrase freq. for current row */

  /* Calculate the phrase frequency (symbol "f(qi,D)" in the documentation)
  ** for each phrase in the query for the current row. */
  rc = fts5Bm25GetData(pApi, pFts, &pData);
  if( rc==SQLITE_OK ){
    aFreq = pData->aFreq;
    memset(aFreq, 0, sizeof(double) * pData->nPhrase);
    rc = pApi->xInstCount(pFts, &nInst);
  }
  for(i=0; rc==SQLITE_OK && i<nInst; i++){
    int ip; int ic; int io;
    rc = pApi->xInst(pFts, i, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      double w = (nVal > ic) ? sqlite3_value_double(apVal[ic]) : 1.0;
      aFreq[ip] += w;
    }
  }

  /* Figure out the total size of the current row in tokens. */
  if( rc==SQLITE_OK ){
    int nTok;
    rc = pApi->xColumnSize(pFts, -1, &nTok);
    D = (double)nTok;
  }

  /* Determine the BM25 score for the current row. */
  for(i=0; rc==SQLITE_OK && i<pData->nPhrase; i++){
    score += pData->aIDF[i] * (
      ( aFreq[i] * (k1 + 1.0) ) / 
      ( aFreq[i] + k1 * (1 - b + b * D / pData->avgdl) )
    );
  }
  
  /* If no error has occurred, return the calculated score. Otherwise,
  ** throw an SQL exception.  */
  if( rc==SQLITE_OK ){
    sqlite3_result_double(pCtx, -1.0 * score);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
}